

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCheck.hpp
# Opt level: O0

void FMB::ModelCheck::doCheck(UnitList *units)

{
  bool bVar1;
  UnitInputType UVar2;
  uint uVar3;
  Connective CVar4;
  undefined7 extraout_var;
  SList *pSVar5;
  Term *this;
  undefined8 uVar6;
  ostream *poVar7;
  uint *puVar8;
  Symbol *this_00;
  Unit *this_01;
  undefined7 extraout_var_00;
  int __flags;
  ulong in_RCX;
  void *__child_stack;
  char *pcVar9;
  List<Kernel::Unit_*> *in_RDI;
  void *in_R8;
  pair<const_unsigned_int_&,_const_unsigned_int_&> pVar10;
  bool res;
  Unit *u_2;
  Iterator uit_2;
  bool allTrue;
  Literal *lit;
  Formula *def;
  uint negated;
  Iterator fit_1;
  FormulaList *defs;
  Formula *inner;
  Formula *formula_1;
  string name_1;
  Unit *u_1;
  Iterator uit_1;
  Term *con;
  uint count;
  Iterator dit;
  Set<Kernel::Term_*,_Lib::DefaultHash> *curDomainConstants_1;
  uint *curModelSize_2;
  uint *sort_1;
  VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> it;
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> domainConstantNumber;
  Set<Kernel::Term_*,_Lib::DefaultHash> domainConstants;
  FiniteModelMultiSorted model;
  uint *curModelSize_1;
  uint *sort;
  VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> it_1;
  DArray<unsigned_int> sortSizesArray;
  Literal *l;
  Formula *arg;
  Iterator fit;
  FormulaList *args;
  int single_var;
  __single_object curDomainConstants;
  uint curModelSize;
  uint curSort;
  Formula *subformula;
  Formula *formula;
  string name;
  Unit *u;
  Iterator uit;
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  domainConstantsPerSort;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> sortSizes;
  undefined4 in_stack_fffffffffffff7a8;
  uint in_stack_fffffffffffff7ac;
  Signature *in_stack_fffffffffffff7b0;
  Unit *in_stack_fffffffffffff7b8;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *in_stack_fffffffffffff7c0;
  Unit *in_stack_fffffffffffff7c8;
  undefined7 in_stack_fffffffffffff7d0;
  undefined1 in_stack_fffffffffffff7d7;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *in_stack_fffffffffffff7d8;
  DArray<unsigned_int> *in_stack_fffffffffffff7e0;
  char *in_stack_fffffffffffff7e8;
  undefined7 in_stack_fffffffffffff7f0;
  undefined1 in_stack_fffffffffffff7f7;
  DArray<unsigned_int> *in_stack_fffffffffffff7f8;
  undefined7 in_stack_fffffffffffff800;
  undefined1 in_stack_fffffffffffff807;
  int *in_stack_fffffffffffff808;
  Signature *in_stack_fffffffffffff810;
  bool local_73a;
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffff930;
  Set<Kernel::Term_*,_Lib::DefaultHash> *in_stack_fffffffffffff938;
  unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
  *in_stack_fffffffffffff940;
  uint *in_stack_fffffffffffff948;
  uint *in_stack_fffffffffffff950;
  uint local_5c8;
  undefined1 in_stack_fffffffffffffaa7;
  Term *in_stack_fffffffffffffaa8;
  string local_510 [32];
  Unit *local_4f0;
  Iterator local_4e8;
  byte local_4d9;
  Literal *local_4d8;
  Formula *local_4d0;
  undefined4 local_4c4;
  Iterator local_4c0;
  FormulaList *local_4b8;
  undefined1 local_4a9;
  undefined1 local_461;
  Formula *local_420;
  Formula *local_418;
  undefined4 local_410;
  byte local_40b;
  byte local_40a;
  allocator<char> local_409;
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [32];
  string local_3c0 [24];
  Formula *in_stack_fffffffffffffc58;
  Iterator local_398 [4];
  string local_378 [32];
  Term *local_358;
  int local_34c;
  Iterator local_348;
  string local_338 [32];
  string local_318 [32];
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *local_2f8;
  uint *local_2f0;
  uint *local_2e8;
  pair<const_unsigned_int_&,_const_unsigned_int_&> local_2e0;
  DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_2c8 [2];
  DArray<unsigned_int> local_278 [10];
  uint *local_180;
  uint *local_178;
  pair<const_unsigned_int_&,_const_unsigned_int_&> local_170;
  DArray<unsigned_int> local_158;
  Literal *local_138;
  Formula *local_130;
  Iterator local_128;
  FormulaList *local_120;
  undefined4 local_114;
  int local_104;
  uint64_t local_100;
  uint local_f4;
  Formula *local_f0;
  Formula *local_e8;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  Unit *local_78;
  Iterator local_70 [2];
  undefined8 local_60;
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  local_58;
  DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> local_30;
  List<Kernel::Unit_*> *local_8;
  
  local_8 = in_RDI;
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap(&local_30);
  Lib::
  DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::DHMap(&local_58);
  Lib::List<Kernel::Unit_*>::Iterator::Iterator(local_70,local_8);
  do {
    do {
      bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x187911);
      if (!bVar1) {
        uVar3 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::size
                          (&local_30);
        if (uVar3 == 0) {
          uVar6 = __cxa_allocate_exception(0x50);
          Lib::UserErrorException::Exception
                    ((UserErrorException *)in_stack_fffffffffffff7b0,
                     (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
          __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        poVar7 = std::operator<<((ostream *)&std::cout,"Loading model...");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Kernel::Signature::typeCons((Signature *)0x188302);
        Lib::DArray<unsigned_int>::DArray
                  ((DArray<unsigned_int> *)in_stack_fffffffffffff7c0,
                   (size_t)in_stack_fffffffffffff7b8);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::items
                  (in_stack_fffffffffffff7d8);
        while( true ) {
          __flags = (int)in_RCX;
          bVar1 = Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
                  hasNext((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> *
                          )0x18834b);
          if (!bVar1) break;
          pVar10 = Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
                   next((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> *)
                        0x188371);
          local_170 = pVar10;
          local_178 = std::get<0ul,unsigned_int_const&,unsigned_int_const&>
                                ((pair<const_unsigned_int_&,_const_unsigned_int_&> *)0x1883b8);
          local_180 = std::get<1ul,unsigned_int_const&,unsigned_int_const&>
                                ((pair<const_unsigned_int_&,_const_unsigned_int_&> *)0x1883cd);
          uVar3 = *local_180;
          puVar8 = Lib::DArray<unsigned_int>::operator[](&local_158,(ulong)*local_178);
          in_RCX = (ulong)uVar3;
          *puVar8 = uVar3;
        }
        Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
        ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> *)
                         in_stack_fffffffffffff7b0);
        Lib::DArray<unsigned_int>::clone(local_278,(__fn *)&local_158,__child_stack,__flags,in_R8);
        FiniteModelMultiSorted::FiniteModelMultiSorted
                  ((FiniteModelMultiSorted *)
                   CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800),
                   in_stack_fffffffffffff7f8);
        Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff7b0);
        Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Set
                  ((Set<Kernel::Term_*,_Lib::DefaultHash> *)0x1884b3);
        Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
                  (local_2c8);
        poVar7 = std::operator<<((ostream *)&std::cout,"Detected model with ");
        uVar3 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::size
                          (&local_30);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,uVar3);
        poVar7 = std::operator<<(poVar7," sorts.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::items
                  (in_stack_fffffffffffff7d8);
        pVar10.second = in_stack_fffffffffffff948;
        pVar10.first = in_stack_fffffffffffff950;
        while( true ) {
          bVar1 = Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
                  hasNext((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> *
                          )0x18856f);
          if (!bVar1) break;
          pVar10 = Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
                   next((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> *)
                        0x188595);
          in_stack_fffffffffffff938 = (Set<Kernel::Term_*,_Lib::DefaultHash> *)&local_2e0;
          local_2e0 = pVar10;
          local_2e8 = std::get<0ul,unsigned_int_const&,unsigned_int_const&>
                                ((pair<const_unsigned_int_&,_const_unsigned_int_&> *)0x1885dc);
          local_2f0 = std::get<1ul,unsigned_int_const&,unsigned_int_const&>
                                ((pair<const_unsigned_int_&,_const_unsigned_int_&> *)0x1885f1);
          in_stack_fffffffffffff940 =
               Lib::
               DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::get((DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac);
          in_stack_fffffffffffff930 =
               (DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               std::
               unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
               ::operator*((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                            *)in_stack_fffffffffffff7b0);
          local_2f8 = in_stack_fffffffffffff930;
          this_00 = Kernel::Signature::getTypeCon
                              (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac);
          Kernel::Signature::Symbol::name_abi_cxx11_(this_00);
          std::operator+((char *)in_stack_fffffffffffff7f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff7b8,(char *)in_stack_fffffffffffff7b0);
          poVar7 = std::operator<<((ostream *)&std::cout,local_318);
          std::ostream::operator<<(poVar7,*local_2f0);
          std::__cxx11::string::~string(local_318);
          std::__cxx11::string::~string(local_338);
          poVar7 = std::operator<<((ostream *)&std::cout,", domain elements are:");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Iterator::Iterator
                    (&local_348,(Set<Kernel::Term_*,_Lib::DefaultHash> *)local_2f8);
          local_34c = 1;
          while( true ) {
            bVar1 = Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Iterator::hasNext
                              ((Iterator *)
                               CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
            if (!bVar1) break;
            local_358 = Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Iterator::next(&local_348);
            poVar7 = std::operator<<((ostream *)&std::cout,"    ");
            Kernel::Term::toString_abi_cxx11_
                      (in_stack_fffffffffffffaa8,(bool)in_stack_fffffffffffffaa7);
            poVar7 = std::operator<<(poVar7,local_378);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_378);
            Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::insert
                      ((Set<Kernel::Term_*,_Lib::DefaultHash> *)in_stack_fffffffffffff7c0,
                       (Term *)in_stack_fffffffffffff7b8);
            Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                       (Term *)in_stack_fffffffffffff7c8,
                       (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20));
            Kernel::Term::functor(local_358);
            Lib::DArray<unsigned_int>::DArray
                      ((DArray<unsigned_int> *)in_stack_fffffffffffff7c0,
                       (size_t)in_stack_fffffffffffff7b8);
            FiniteModelMultiSorted::addFunctionDefinition
                      ((FiniteModelMultiSorted *)
                       CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                       (uint)((ulong)in_stack_fffffffffffff7e8 >> 0x20),in_stack_fffffffffffff7e0,
                       (uint)((ulong)in_stack_fffffffffffff7d8 >> 0x20));
            Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff7b0);
            local_34c = local_34c + 1;
          }
        }
        Lib::List<Kernel::Unit_*>::Iterator::Iterator(local_398,local_8);
        while( true ) {
          do {
            bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x188a16);
            if (!bVar1) {
              poVar7 = std::operator<<((ostream *)&std::cout,"Model loaded");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              poVar7 = std::operator<<((ostream *)&std::cout,"Checking formulas...");
              std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              local_4d9 = 1;
              Lib::List<Kernel::Unit_*>::Iterator::Iterator(&local_4e8,local_8);
              while( true ) {
                bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x189388);
                if (!bVar1) break;
                local_4f0 = Lib::List<Kernel::Unit_*>::Iterator::next
                                      ((Iterator *)in_stack_fffffffffffff7b0);
                UVar2 = Kernel::Unit::inputType((Unit *)0x1893c9);
                if (UVar2 != MODEL_DEFINITION) {
                  poVar7 = std::operator<<((ostream *)&std::cout,"Checking ");
                  Kernel::Unit::toString_abi_cxx11_(in_stack_fffffffffffff7b8);
                  poVar7 = std::operator<<(poVar7,local_510);
                  poVar7 = std::operator<<(poVar7,"...");
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                  std::__cxx11::string::~string(local_510);
                  bVar1 = FiniteModelMultiSorted::evaluate
                                    ((FiniteModelMultiSorted *)
                                     CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                                     in_stack_fffffffffffff7c8);
                  local_4d9 = bVar1 & local_4d9;
                  in_stack_fffffffffffff7d7 = bVar1;
                  in_stack_fffffffffffff7c8 =
                       (Unit *)std::operator<<((ostream *)&std::cout,"Evaluates to ");
                  pcVar9 = "False";
                  if (bVar1) {
                    pcVar9 = "True";
                  }
                  poVar7 = std::operator<<((ostream *)in_stack_fffffffffffff7c8,pcVar9);
                  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
                }
              }
              if ((local_4d9 & 1) == 0) {
                in_stack_fffffffffffff7b0 =
                     (Signature *)
                     std::operator<<((ostream *)&std::cout,"There was a false formula!");
                std::ostream::operator<<
                          (in_stack_fffffffffffff7b0,std::endl<char,std::char_traits<char>>);
              }
              else {
                poVar7 = std::operator<<((ostream *)&std::cout,"All formulas evaluated to True!");
                std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
              }
              Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
              ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>
                                *)in_stack_fffffffffffff7b0);
              Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                        ((DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *
                         )in_stack_fffffffffffff7b0);
              Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::~Set
                        ((Set<Kernel::Term_*,_Lib::DefaultHash> *)in_stack_fffffffffffff7b0);
              FiniteModelMultiSorted::~FiniteModelMultiSorted
                        ((FiniteModelMultiSorted *)in_stack_fffffffffffff7b0);
              Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff7b0);
              Lib::
              DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::~DHMap((DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)in_stack_fffffffffffff7b0);
              Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                        ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                         in_stack_fffffffffffff7b0);
              return;
            }
            this_01 = Lib::List<Kernel::Unit_*>::Iterator::next
                                ((Iterator *)in_stack_fffffffffffff7b0);
            UVar2 = Kernel::Unit::inputType((Unit *)0x188a63);
          } while (UVar2 != MODEL_DEFINITION);
          std::__cxx11::string::string(local_3c0);
          bVar1 = Parse::TPTP::findAxiomName
                            ((Unit *)in_stack_fffffffffffff7b0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
                            );
          local_60 = CONCAT71(extraout_var_00,bVar1);
          if (!bVar1) break;
          std::allocator<char>::allocator();
          local_40a = 0;
          local_40b = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                     in_stack_fffffffffffff7e8,(allocator<char> *)in_stack_fffffffffffff7e0);
          bVar1 = Lib::StringUtils::starts_with
                            ((string *)in_stack_fffffffffffff7b0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
                            );
          local_73a = true;
          if (!bVar1) {
            std::allocator<char>::allocator();
            local_40a = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
                       in_stack_fffffffffffff7e8,(allocator<char> *)in_stack_fffffffffffff7e0);
            local_40b = 1;
            local_73a = Lib::StringUtils::starts_with
                                  ((string *)in_stack_fffffffffffff7b0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
          }
          if ((local_40b & 1) != 0) {
            std::__cxx11::string::~string(local_408);
          }
          if ((local_40a & 1) != 0) {
            std::allocator<char>::~allocator(&local_409);
          }
          std::__cxx11::string::~string(local_3e0);
          std::allocator<char>::~allocator(&local_3e1);
          if (local_73a == false) {
            bVar1 = Kernel::Unit::isClause(this_01);
            if (bVar1) {
              uVar6 = __cxa_allocate_exception(0x50);
              Lib::UserErrorException::Exception
                        ((UserErrorException *)in_stack_fffffffffffff7b0,
                         (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
              __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                          Lib::UserErrorException::~UserErrorException);
            }
            local_418 = Kernel::Unit::getFormula
                                  ((Unit *)CONCAT44(in_stack_fffffffffffff7ac,
                                                    in_stack_fffffffffffff7a8));
            CVar4 = Kernel::Formula::connective(local_418);
            if (CVar4 == NOT) {
              local_420 = Kernel::Formula::uarg((Formula *)0x188dcc);
              CVar4 = Kernel::Formula::connective(local_420);
              if (CVar4 != LITERAL) {
                local_461 = 1;
                uVar6 = __cxa_allocate_exception(0x50);
                Kernel::Formula::toString_abi_cxx11_(in_stack_fffffffffffffc58);
                std::operator+((char *)in_stack_fffffffffffff7b8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff7b0);
                Lib::UserErrorException::Exception
                          ((UserErrorException *)in_stack_fffffffffffff7b0,
                           (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
                local_461 = 0;
                __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                            Lib::UserErrorException::~UserErrorException);
              }
              Kernel::Formula::literal((Formula *)0x188e15);
              addDefinition((FiniteModelMultiSorted *)pVar10.first,(Literal *)pVar10.second,
                            SUB81((ulong)in_stack_fffffffffffff940 >> 0x38,0),
                            in_stack_fffffffffffff938,in_stack_fffffffffffff930);
            }
            else {
              CVar4 = Kernel::Formula::connective(local_418);
              if (CVar4 == LITERAL) {
                Kernel::Formula::literal((Formula *)0x188f8a);
                addDefinition((FiniteModelMultiSorted *)pVar10.first,(Literal *)pVar10.second,
                              SUB81((ulong)in_stack_fffffffffffff940 >> 0x38,0),
                              in_stack_fffffffffffff938,in_stack_fffffffffffff930);
              }
              else {
                CVar4 = Kernel::Formula::connective(local_418);
                if (CVar4 != AND) {
                  local_4a9 = 1;
                  uVar6 = __cxa_allocate_exception(0x50);
                  Kernel::Formula::toString_abi_cxx11_(in_stack_fffffffffffffc58);
                  std::operator+((char *)in_stack_fffffffffffff7b8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff7b0);
                  Lib::UserErrorException::Exception
                            ((UserErrorException *)in_stack_fffffffffffff7b0,
                             (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
                            );
                  local_4a9 = 0;
                  __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                              Lib::UserErrorException::~UserErrorException);
                }
                local_4b8 = Kernel::Formula::args((Formula *)0x1890fb);
                Lib::List<Kernel::Formula_*>::Iterator::Iterator(&local_4c0,local_4b8);
                while( true ) {
                  bVar1 = Lib::List<Kernel::Formula_*>::Iterator::hasNext((Iterator *)0x18913b);
                  if (!bVar1) break;
                  local_4c4 = 0;
                  local_4d0 = Lib::List<Kernel::Formula_*>::Iterator::next
                                        ((Iterator *)in_stack_fffffffffffff7b0);
                  CVar4 = Kernel::Formula::connective(local_4d0);
                  if (CVar4 == NOT) {
                    local_4d0 = Kernel::Formula::uarg((Formula *)0x1891b5);
                    local_4c4 = 1;
                  }
                  CVar4 = Kernel::Formula::connective(local_4d0);
                  if (CVar4 != LITERAL) {
                    uVar6 = __cxa_allocate_exception(0x50);
                    Lib::UserErrorException::Exception
                              ((UserErrorException *)in_stack_fffffffffffff7b0,
                               (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
                              );
                    __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                                Lib::UserErrorException::~UserErrorException);
                  }
                  local_4d8 = Kernel::Formula::literal((Formula *)0x18926c);
                  addDefinition((FiniteModelMultiSorted *)pVar10.first,(Literal *)pVar10.second,
                                SUB81((ulong)in_stack_fffffffffffff940 >> 0x38,0),
                                in_stack_fffffffffffff938,in_stack_fffffffffffff930);
                }
              }
            }
            local_410 = 0;
          }
          else {
            local_410 = 0xc;
          }
          std::__cxx11::string::~string(local_3c0);
        }
        std::__cxx11::string::~string(local_3c0);
        Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_>::
        ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_unsigned_int_&>_> *)
                         in_stack_fffffffffffff7b0);
        Lib::DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<Kernel::Term_*,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   in_stack_fffffffffffff7b0);
        Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::~Set
                  ((Set<Kernel::Term_*,_Lib::DefaultHash> *)in_stack_fffffffffffff7b0);
        FiniteModelMultiSorted::~FiniteModelMultiSorted
                  ((FiniteModelMultiSorted *)in_stack_fffffffffffff7b0);
        Lib::DArray<unsigned_int>::~DArray((DArray<unsigned_int> *)in_stack_fffffffffffff7b0);
LAB_0018962f:
        Lib::
        DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::~DHMap((DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)in_stack_fffffffffffff7b0);
        Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   in_stack_fffffffffffff7b0);
        _Unwind_Resume(local_60);
      }
      local_78 = Lib::List<Kernel::Unit_*>::Iterator::next((Iterator *)in_stack_fffffffffffff7b0);
      UVar2 = Kernel::Unit::inputType((Unit *)0x18795e);
    } while (UVar2 != MODEL_DEFINITION);
    std::__cxx11::string::string(local_98);
    bVar1 = Parse::TPTP::findAxiomName
                      ((Unit *)in_stack_fffffffffffff7b0,
                       (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    local_60 = CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      std::__cxx11::string::~string(local_98);
      goto LAB_0018962f;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff7f7,in_stack_fffffffffffff7f0),
               in_stack_fffffffffffff7e8,(allocator<char> *)in_stack_fffffffffffff7e0);
    bVar1 = Lib::StringUtils::starts_with
                      ((string *)in_stack_fffffffffffff7b0,
                       (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator(&local_b9);
    if (bVar1) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Finite domain axiom found:");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      Kernel::Unit::toString_abi_cxx11_(in_stack_fffffffffffff7b8);
      in_stack_fffffffffffffaa8 = (Term *)std::operator<<(poVar7,local_e0);
      std::ostream::operator<<(in_stack_fffffffffffffaa8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_e0);
      in_stack_fffffffffffffaa7 = Kernel::Unit::isClause(local_78);
      if ((bool)in_stack_fffffffffffffaa7) {
        uVar6 = __cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception
                  ((UserErrorException *)in_stack_fffffffffffff7b0,
                   (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      local_e8 = Kernel::Unit::getFormula
                           ((Unit *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      CVar4 = Kernel::Formula::connective(local_e8);
      if (CVar4 != FORALL) {
        uVar6 = __cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception
                  ((UserErrorException *)in_stack_fffffffffffff7b0,
                   (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      local_f0 = Kernel::Formula::qarg((Formula *)0x187cd1);
      Kernel::Formula::vars((Formula *)0x187cf8);
      uVar3 = Lib::List<unsigned_int>::length((List<unsigned_int> *)in_stack_fffffffffffff7b0);
      if (uVar3 != 1) {
        uVar6 = __cxa_allocate_exception(0x50);
        Lib::UserErrorException::Exception
                  ((UserErrorException *)in_stack_fffffffffffff7b0,
                   (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
        __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      pSVar5 = Kernel::Formula::sorts((Formula *)0x187d9d);
      if (pSVar5 == (SList *)0x0) {
        local_5c8 = Kernel::Signature::getDefaultSort(in_stack_fffffffffffff810);
      }
      else {
        pSVar5 = Kernel::Formula::sorts((Formula *)0x187dc2);
        local_100 = (uint64_t)Lib::List<Kernel::TermList>::head(pSVar5);
        this = Kernel::TermList::term((TermList *)0x187e00);
        local_5c8 = Kernel::Term::functor(this);
      }
      local_f4 = local_5c8;
      local_104 = 0;
      std::make_unique<Lib::Set<Kernel::Term*,Lib::DefaultHash>>();
      local_114 = 0xffffffff;
      CVar4 = Kernel::Formula::connective(local_f0);
      if (CVar4 == OR) {
        local_120 = Kernel::Formula::args((Formula *)0x187ebf);
        Lib::List<Kernel::Formula_*>::Iterator::Iterator(&local_128,local_120);
        while (bVar1 = Lib::List<Kernel::Formula_*>::Iterator::hasNext((Iterator *)0x187eff), bVar1)
        {
          local_104 = local_104 + 1;
          local_130 = Lib::List<Kernel::Formula_*>::Iterator::next
                                ((Iterator *)in_stack_fffffffffffff7b0);
          CVar4 = Kernel::Formula::connective(local_130);
          if (CVar4 != LITERAL) {
            uVar6 = __cxa_allocate_exception(0x50);
            Lib::UserErrorException::Exception
                      ((UserErrorException *)in_stack_fffffffffffff7b0,
                       (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
            __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                        Lib::UserErrorException::~UserErrorException);
          }
          local_138 = Kernel::Formula::literal((Formula *)0x188007);
          std::
          unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
          ::operator*((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                       *)in_stack_fffffffffffff7b0);
          checkIsDomainLiteral
                    ((Literal *)in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                     (Set<Kernel::Term_*,_Lib::DefaultHash> *)
                     CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
        }
      }
      else {
        CVar4 = Kernel::Formula::connective(local_f0);
        if (CVar4 != LITERAL) {
          uVar6 = __cxa_allocate_exception(0x50);
          Lib::UserErrorException::Exception
                    ((UserErrorException *)in_stack_fffffffffffff7b0,
                     (char *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
          __cxa_throw(uVar6,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        local_104 = 1;
        Kernel::Formula::literal((Formula *)0x1880ab);
        std::
        unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
        ::operator*((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                     *)in_stack_fffffffffffff7b0);
        checkIsDomainLiteral
                  ((Literal *)in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                   (Set<Kernel::Term_*,_Lib::DefaultHash> *)
                   CONCAT17(in_stack_fffffffffffff807,in_stack_fffffffffffff800));
      }
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::set
                (in_stack_fffffffffffff7c0,(uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),
                 (uint)in_stack_fffffffffffff7b8);
      std::
      unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ::unique_ptr((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                    *)in_stack_fffffffffffff7b0,
                   (unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                    *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Lib::
      DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::set((DHMap<unsigned_int,_std::unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
             *)CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
            (uint)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
            (unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
             *)in_stack_fffffffffffff7c0);
      std::
      unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ::~unique_ptr((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                     *)in_stack_fffffffffffff7b0);
      std::
      unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
      ::~unique_ptr((unique_ptr<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>,_std::default_delete<Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_>_>
                     *)in_stack_fffffffffffff7b0);
    }
    std::__cxx11::string::~string(local_98);
  } while( true );
}

Assistant:

static void doCheck(UnitList* units)
{
  // find model size
  // looking for a domain axiom with a name starting 'finite_domain' (TODO search for something of the right shape)

  DHMap<unsigned,unsigned> sortSizes;
  DHMap<unsigned,std::unique_ptr<Set<Term*>>> domainConstantsPerSort;

  // first just search for finite_domain axiom (TODO: do this for every sort!)
  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain")){
        std::cout << "Finite domain axiom found:" << std::endl << u->toString() << std::endl;
        // Set model size and domainConstants
        // And check it is a finite domain axiom
        if(u->isClause()) USER_ERROR("finite_domain in cnf (use fof/tff instead)");

        Formula* formula = u->getFormula();
        if(formula->connective()!=Connective::FORALL) USER_ERROR("finite_domain is not a domain axiom");
        Formula* subformula = formula->qarg();

        if (VList::length(formula->vars()) != 1) USER_ERROR("finite_domain must start with forall over a single variable");
        unsigned curSort = (formula->sorts()) ? formula->sorts()->head().term()->functor() : env.signature->getDefaultSort();

        unsigned curModelSize = 0;
        auto curDomainConstants = std::make_unique<Set<Term*>>();

        int single_var = -1;
        if (subformula->connective()==Connective::OR) {
          FormulaList* args = subformula->args();
          FormulaList::Iterator fit(args);
          while(fit.hasNext()){
            curModelSize++;
            Formula* arg = fit.next();
            if(arg->connective()!=Connective::LITERAL) USER_ERROR("finite_domain is not a domain axiom");
            Literal* l = arg->literal();
            checkIsDomainLiteral(l,single_var,*curDomainConstants);
          }
        } else if (subformula->connective()==Connective::LITERAL) {
          curModelSize = 1;
          checkIsDomainLiteral(subformula->literal(),single_var,*curDomainConstants);
        } else USER_ERROR("finite_domain is not a domain axiom");

        sortSizes.set(curSort,curModelSize);
        domainConstantsPerSort.set(curSort,std::move(curDomainConstants));
      }
    }
  }

  if (sortSizes.size() == 0) {
    USER_ERROR("No domain definition found!\n Use vampire(model_check,model_start). MODEL_DEFINITION_FORMULAS. vampire(model_check,model_end).");
  }

  std::cout << "Loading model..." << std::endl;
  DArray<unsigned> sortSizesArray(env.signature->typeCons());
  {
    auto it = sortSizes.items();
    while (it.hasNext()) {
      auto [sort,curModelSize] = it.next();
      sortSizesArray[sort] = curModelSize;
    }
  }
  // TODO can we pass a reference here instead of clone()ing?
  FiniteModelMultiSorted model(sortSizesArray.clone());

  Set<Term*> domainConstants; // union of all the perSort ones
  DHMap<Term*,unsigned> domainConstantNumber;

  std::cout << "Detected model with " << sortSizes.size() << " sorts." << std::endl;
  auto it = sortSizes.items();
  while (it.hasNext()) {
    auto [sort,curModelSize] = it.next();
    auto& curDomainConstants = *domainConstantsPerSort.get(sort);
    ASS_EQ(curModelSize,(unsigned)curDomainConstants.size());

    std::cout << "  domain for " + env.signature->getTypeCon(sort)->name() + " of size " << curModelSize;
    std::cout << ", domain elements are:" << std::endl;

    // number the domain constants
    Set<Term*>::Iterator dit(curDomainConstants);
    unsigned count=1;
    while(dit.hasNext()){
      Term* con = dit.next();
      std::cout << "    " << con->toString() << std::endl;
      domainConstants.insert(con);
      domainConstantNumber.insert(con,count);
      model.addFunctionDefinition(con->functor(),DArray<unsigned>(0),count);
      count++;
    }
  }

  {
    UnitList::Iterator uit(units);
    while(uit.hasNext()){
      Unit* u = uit.next();
      if(u->inputType()!= UnitInputType::MODEL_DEFINITION) continue;
      std::string name;
      ALWAYS(Parse::TPTP::findAxiomName(u,name));
      if(StringUtils::starts_with(name,"finite_domain") || StringUtils::starts_with(name,"distinct_domain")) continue;

      // All model formulas should be conjunctions of definitions
      // TODO allow for unit clause definitions in the future
      if(u->isClause()) USER_ERROR("Expecting model to use formulas i.e. fof/tff");
      Formula* formula = u->getFormula();

      if(formula->connective()==Connective::NOT){
        Formula* inner = formula->uarg();
        if(inner->connective()==Connective::LITERAL){
          addDefinition(model,inner->literal(),true,domainConstants,domainConstantNumber);
        }
        else USER_ERROR("Unexpected negation in "+formula->toString());
      }
      else if(formula->connective()==Connective::LITERAL){
        addDefinition(model,formula->literal(),false,domainConstants,domainConstantNumber);
      }
      else{
        if(formula->connective()!=Connective::AND)
          USER_ERROR("Expecting conjunction of definitions in model:\n"+formula->toString());
        FormulaList* defs = formula->args();
        FormulaList::Iterator fit(defs);
        while(fit.hasNext()){
          unsigned negated = false;
          Formula* def = fit.next();
          if(def->connective()==Connective::NOT){
            def = def->uarg();
            negated=true;
          }
          if(def->connective()!=Connective::LITERAL) USER_ERROR("Badly formed definition");
          Literal* lit = def->literal();
          addDefinition(model,lit,negated,domainConstants,domainConstantNumber);
        }
      }
    }
    std::cout << "Model loaded" << std::endl;
    std::cout << "Checking formulas..." << std::endl;
    {
      bool allTrue = true;
      UnitList::Iterator uit(units);
      while(uit.hasNext()){
        Unit* u = uit.next();
        if(u->inputType()== UnitInputType::MODEL_DEFINITION) continue;

        std::cout << "Checking " << u->toString() << "..." << std::endl;
        bool res = model.evaluate(u);
        allTrue &= res;
        std::cout << "Evaluates to " << (res ? "True" : "False") << std::endl;
      }
      if (allTrue) {
        std::cout << "All formulas evaluated to True!" << std::endl;
      } else {
        std::cout << "There was a false formula!" << std::endl;
      }
    }
  }
}